

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::DynamicMapField::AllocateMapValue
          (DynamicMapField *this,MapValueRef *map_val)

{
  once_flag *__once;
  int iVar1;
  undefined4 extraout_var;
  FieldDescriptor *field;
  Message *pMVar2;
  undefined4 extraout_var_00;
  undefined8 *puVar3;
  Reflection *this_00;
  FieldDescriptor *local_50;
  string local_48;
  
  iVar1 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x15])();
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"value","");
  field = Descriptor::FindFieldByName((Descriptor *)CONCAT44(extraout_var,iVar1),&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (*(once_flag **)(field + 0x30) == (once_flag *)0x0) {
    iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4);
    map_val->type_ = iVar1;
  }
  else {
    local_48._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_50 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_48,&local_50)
    ;
    __once = *(once_flag **)(field + 0x30);
    iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4);
    map_val->type_ = iVar1;
    if (__once != (once_flag *)0x0) {
      local_48._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_50 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (__once,(_func_void_FieldDescriptor_ptr **)&local_48,&local_50);
      iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4);
    }
  }
  switch(iVar1) {
  case 1:
  case 3:
  case 6:
  case 8:
    puVar3 = (undefined8 *)operator_new(4);
    *(undefined4 *)puVar3 = 0;
    break;
  case 2:
  case 4:
  case 5:
    puVar3 = (undefined8 *)operator_new(8);
    *puVar3 = 0;
    break;
  case 7:
    puVar3 = (undefined8 *)operator_new(1);
    *(undefined1 *)puVar3 = 0;
    break;
  case 9:
    puVar3 = (undefined8 *)operator_new(0x20);
    *puVar3 = puVar3 + 2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    break;
  case 10:
    (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x15])();
    pMVar2 = Reflection::GetMessage(this_00,this->default_entry_,field,(MessageFactory *)0x0);
    iVar1 = (*(pMVar2->super_MessageLite)._vptr_MessageLite[3])(pMVar2);
    puVar3 = (undefined8 *)CONCAT44(extraout_var_00,iVar1);
    break;
  default:
    goto switchD_00288ae9_default;
  }
  map_val->data_ = puVar3;
switchD_00288ae9_default:
  return;
}

Assistant:

void DynamicMapField::AllocateMapValue(MapValueRef* map_val) {
  const FieldDescriptor* val_des =
      default_entry_->GetDescriptor()->FindFieldByName("value");
  map_val->SetType(val_des->cpp_type());
  // Allocate memory for the MapValueRef, and initialize to
  // default value.
  switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)           \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: { \
    TYPE* value = new TYPE();                \
    map_val->SetValue(value);                \
    break;                                   \
  }
    HANDLE_TYPE(INT32, int32);
    HANDLE_TYPE(INT64, int64);
    HANDLE_TYPE(UINT32, uint32);
    HANDLE_TYPE(UINT64, uint64);
    HANDLE_TYPE(DOUBLE, double);
    HANDLE_TYPE(FLOAT, float);
    HANDLE_TYPE(BOOL, bool);
    HANDLE_TYPE(STRING, std::string);
    HANDLE_TYPE(ENUM, int32);
#undef HANDLE_TYPE
    case FieldDescriptor::CPPTYPE_MESSAGE: {
      const Message& message =
          default_entry_->GetReflection()->GetMessage(*default_entry_, val_des);
      Message* value = message.New();
      map_val->SetValue(value);
      break;
    }
  }
}